

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O3

BranchReloc * __thiscall
IRBuilderAsmJs::CreateRelocRecord
          (IRBuilderAsmJs *this,BranchInstr *branchInstr,uint32 offset,uint32 targetOffset)

{
  RealCount *pRVar1;
  SList<BranchReloc_*,_Memory::ArenaAllocator,_RealCount> *pSVar2;
  BranchReloc *pBVar3;
  Type pSVar4;
  
  pBVar3 = (BranchReloc *)new<Memory::JitArenaAllocator>(0x18,this->m_tempAlloc,0x3eba5c);
  pBVar3->branchInstr = branchInstr;
  pBVar3->offset = targetOffset;
  pBVar3->isNotBackEdge = false;
  pBVar3->branchOffset = offset;
  pSVar2 = this->m_branchRelocList;
  pSVar4 = (Type)new<Memory::ArenaAllocator>(0x10,pSVar2->allocator,0x364470);
  pSVar4[1].next = (Type)pBVar3;
  pSVar4->next = (pSVar2->super_SListBase<BranchReloc_*,_Memory::ArenaAllocator,_RealCount>).
                 super_SListNodeBase<Memory::ArenaAllocator>.next;
  (pSVar2->super_SListBase<BranchReloc_*,_Memory::ArenaAllocator,_RealCount>).
  super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar4;
  pRVar1 = &(pSVar2->super_SListBase<BranchReloc_*,_Memory::ArenaAllocator,_RealCount>).
            super_RealCount;
  pRVar1->count = pRVar1->count + 1;
  return pBVar3;
}

Assistant:

BranchReloc *
IRBuilderAsmJs::CreateRelocRecord(IR::BranchInstr * branchInstr, uint32 offset, uint32 targetOffset)
{
    BranchReloc * reloc = JitAnew(m_tempAlloc, BranchReloc, branchInstr, offset, targetOffset);
    m_branchRelocList->Prepend(reloc);
    return reloc;
}